

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

int Gia_ManFindChains_rec
              (Gia_Man_t *p,int iMaj,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Int_t *vLength)

{
  uint uVar1;
  uint iMaj_00;
  uint iMaj_01;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong local_50;
  
  if (-1 < iMaj) {
    if (iMaj < vMap->nSize) {
      uVar1 = vMap->pArray[(uint)iMaj];
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 0) {
        __assert_fail("Vec_IntEntry(vMap, iMaj) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x1dc,
                      "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (iMaj < vLength->nSize) {
        if (-1 < vLength->pArray[(uint)iMaj]) {
          return vLength->pArray[(uint)iMaj];
        }
        if (p->nObjs <= iMaj) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar4 = (uint)*(undefined8 *)(p->pObjs + (uint)iMaj);
        if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iMaj))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x1df,
                        "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar5 = uVar1 * 5;
        uVar1 = vFadds->nSize;
        if (((iVar5 < (int)uVar1) && (uVar4 = iVar5 + 1, uVar4 < uVar1)) &&
           (uVar10 = iVar5 + 2, uVar10 < uVar1)) {
          piVar2 = vFadds->pArray;
          uVar1 = piVar2[uVar9 * 5];
          if ((-1 < (int)uVar1) && (uVar1 < (uint)vMap->nSize)) {
            iMaj_00 = piVar2[uVar4];
            iMaj_01 = piVar2[uVar10];
            if (vMap->pArray[uVar1] == -1) {
              iVar5 = 0;
            }
            else {
              iVar5 = Gia_ManFindChains_rec(p,uVar1,vFadds,vMap,vLength);
            }
            if ((-1 < (int)iMaj_00) && ((int)iMaj_00 < vMap->nSize)) {
              if (vMap->pArray[iMaj_00] == -1) {
                iVar6 = 0;
              }
              else {
                iVar6 = Gia_ManFindChains_rec(p,iMaj_00,vFadds,vMap,vLength);
              }
              if ((-1 < (int)iMaj_01) && ((int)iMaj_01 < vMap->nSize)) {
                if (vMap->pArray[iMaj_01] == -1) {
                  iVar7 = 0;
                }
                else {
                  iVar7 = Gia_ManFindChains_rec(p,iMaj_01,vFadds,vMap,vLength);
                }
                iVar8 = iVar7;
                if (iVar7 < iVar6) {
                  iVar8 = iVar6;
                }
                iVar3 = iVar8;
                if (iVar8 < iVar5) {
                  iVar3 = iVar5;
                }
                if ((iVar5 < iVar8) &&
                   ((local_50 = (ulong)uVar4, iVar3 == iVar6 ||
                    (local_50 = (ulong)uVar10, iVar3 == iVar7)))) {
                  piVar2 = vFadds->pArray;
                  iVar5 = piVar2[uVar9 * 5];
                  piVar2[uVar9 * 5] = piVar2[local_50];
                  piVar2[local_50] = iVar5;
                }
                if (iMaj < vLength->nSize) {
                  vLength->pArray[(uint)iMaj] = iVar3 + 1;
                  return iVar3 + 1;
                }
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManFindChains_rec( Gia_Man_t * p, int iMaj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Int_t * vLength )
{
    assert( Vec_IntEntry(vMap, iMaj) >= 0 ); // MAJ
    if ( Vec_IntEntry(vLength, iMaj) >= 0 )
        return Vec_IntEntry(vLength, iMaj);
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iMaj)) );
    {
        int iFadd = Vec_IntEntry( vMap, iMaj );
        int iXor0 = Vec_IntEntry( vFadds, 5*iFadd+0 );
        int iXor1 = Vec_IntEntry( vFadds, 5*iFadd+1 );
        int iXor2 = Vec_IntEntry( vFadds, 5*iFadd+2 );
        int iLen0 = Vec_IntEntry( vMap, iXor0 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor0, vFadds, vMap, vLength );
        int iLen1 = Vec_IntEntry( vMap, iXor1 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor1, vFadds, vMap, vLength );
        int iLen2 = Vec_IntEntry( vMap, iXor2 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor2, vFadds, vMap, vLength );
        int iLen = Abc_MaxInt( iLen0, Abc_MaxInt(iLen1, iLen2) );
        if ( iLen0 < iLen )
        {
            if ( iLen == iLen1 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+1] );
            }
            else if ( iLen == iLen2 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+2] );
            }
        }
        Vec_IntWriteEntry( vLength, iMaj, iLen + 1 );
        return iLen + 1;
    }
}